

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safequeue.h
# Opt level: O1

bool __thiscall SafeQueue<WriterData>::push(SafeQueue<WriterData> *this,WriterData *val)

{
  iterator *piVar1;
  _Map_pointer ppWVar2;
  _Elt_pointer pWVar3;
  ulong uVar4;
  uint8_t *puVar5;
  Commands CVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  int iVar9;
  ulong uVar10;
  
  iVar9 = pthread_mutex_lock((pthread_mutex_t *)&this->m_mtx);
  if (iVar9 == 0) {
    ppWVar2 = (this->m_queue).c.super__Deque_base<WriterData,_std::allocator<WriterData>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node;
    pWVar3 = (this->m_queue).c.super__Deque_base<WriterData,_std::allocator<WriterData>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    uVar10 = ((long)(this->m_queue).c.super__Deque_base<WriterData,_std::allocator<WriterData>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_last -
              (long)(this->m_queue).c.super__Deque_base<WriterData,_std::allocator<WriterData>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_cur >> 5) +
             ((long)pWVar3 -
              (long)(this->m_queue).c.super__Deque_base<WriterData,_std::allocator<WriterData>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_first >> 5) +
             ((((ulong)((long)ppWVar2 -
                       (long)(this->m_queue).c.
                             super__Deque_base<WriterData,_std::allocator<WriterData>_>._M_impl.
                             super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
             (ulong)(ppWVar2 == (_Map_pointer)0x0)) * 0x10;
    uVar4 = this->m_maxSize;
    if (uVar10 < uVar4) {
      if (pWVar3 == (this->m_queue).c.super__Deque_base<WriterData,_std::allocator<WriterData>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<WriterData,std::allocator<WriterData>>::_M_push_back_aux<WriterData_const&>
                  ((deque<WriterData,std::allocator<WriterData>> *)&this->m_queue,val);
      }
      else {
        puVar5 = val->m_buffer;
        iVar9 = val->m_bufferLen;
        uVar8 = *(undefined4 *)&val->field_0xc;
        CVar6 = val->m_command;
        uVar7 = *(undefined4 *)&val->field_0x1c;
        pWVar3->m_mainFile = val->m_mainFile;
        pWVar3->m_command = CVar6;
        *(undefined4 *)&pWVar3->field_0x1c = uVar7;
        pWVar3->m_buffer = puVar5;
        pWVar3->m_bufferLen = iVar9;
        *(undefined4 *)&pWVar3->field_0xc = uVar8;
        piVar1 = &(this->m_queue).c.super__Deque_base<WriterData,_std::allocator<WriterData>_>.
                  _M_impl.super__Deque_impl_data._M_finish;
        piVar1->_M_cur = piVar1->_M_cur + 1;
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_mtx);
    return uVar10 < uVar4;
  }
  std::__throw_system_error(iVar9);
}

Assistant:

virtual bool push(const T& val)
    {
        std::lock_guard<std::mutex> lk(m_mtx);

        if (m_queue.size() >= m_maxSize)
            return false;

        m_queue.push(val);
        return true;
    }